

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestBadBinding::Run(DyndepParserTestBadBinding *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  DyndepParser parser;
  char kInput [61];
  allocator<char> local_159;
  string local_158;
  string local_138;
  DyndepParser local_118;
  char local_58 [64];
  
  builtin_strncpy(local_58 + 0x30,"_restat = 1\n",0xd);
  builtin_strncpy(local_58 + 0x20,"ut: dyndep\n  not",0x10);
  builtin_strncpy(local_58 + 0x10,"sion = 1\nbuild o",0x10);
  builtin_strncpy(local_58,"ninja_dyndep_ver",0x10);
  DyndepParser::DyndepParser
            (&local_118,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,local_58,&local_159);
  bVar2 = DyndepParser::ParseTest(&local_118,&local_138,&local_158);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x153,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_138);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:3: binding is not \'restat\'\n  not_restat = 1\n                ^ near here"
                          ,&local_158);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x156,
             "\"input:3: binding is not \'restat\'\\n\" \"  not_restat = 1\\n\" \"                ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&local_158);
  DyndepParser::~DyndepParser(&local_118);
  return;
}

Assistant:

TEST_F(DyndepParserTest, BadBinding) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"  not_restat = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:3: binding is not 'restat'\n"
            "  not_restat = 1\n"
            "                ^ near here", err);
}